

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

UpdateWitnessStackTxInRequestStruct * __thiscall
cfd::js::api::json::UpdateWitnessStackTxInRequest::ConvertToStruct
          (UpdateWitnessStackTxInRequestStruct *__return_storage_ptr__,
          UpdateWitnessStackTxInRequest *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  undefined1 local_d8 [8];
  _Alloc_hider local_d0;
  char local_c0 [16];
  _Alloc_hider local_b0;
  char local_a0 [16];
  bool local_90;
  _Alloc_hider local_88;
  char local_78 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  (__return_storage_ptr__->txid)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->txid).field_2
  ;
  (__return_storage_ptr__->txid)._M_string_length = 0;
  (__return_storage_ptr__->txid).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->vout = 0;
  (__return_storage_ptr__->witness_stack).index = 0;
  (__return_storage_ptr__->witness_stack).hex._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->witness_stack).hex.field_2;
  (__return_storage_ptr__->witness_stack).hex._M_string_length = 0;
  (__return_storage_ptr__->witness_stack).hex.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->witness_stack).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->witness_stack).type.field_2;
  *(undefined4 *)&(__return_storage_ptr__->witness_stack).type.field_2 = 0x616e6962;
  *(undefined2 *)((long)&(__return_storage_ptr__->witness_stack).type.field_2 + 4) = 0x7972;
  (__return_storage_ptr__->witness_stack).type._M_string_length = 6;
  (__return_storage_ptr__->witness_stack).type.field_2._M_local_buf[6] = '\0';
  (__return_storage_ptr__->witness_stack).der_encode = false;
  (__return_storage_ptr__->witness_stack).sighash_type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->witness_stack).sighash_type.field_2;
  *(undefined4 *)&(__return_storage_ptr__->witness_stack).sighash_type.field_2 = 0x6c6c61;
  (__return_storage_ptr__->witness_stack).sighash_type._M_string_length = 3;
  (__return_storage_ptr__->witness_stack).sighash_anyone_can_pay = false;
  (__return_storage_ptr__->witness_stack).sighash_rangeproof = false;
  p_Var1 = &(__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  p_Var2 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->vout = this->vout_;
  WitnessStackData::ConvertToStruct((WitnessStackDataStruct *)local_d8,&this->witness_stack_);
  (__return_storage_ptr__->witness_stack).index = local_d8._0_4_;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->witness_stack).hex,(string *)&local_d0);
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->witness_stack).type,(string *)&local_b0);
  (__return_storage_ptr__->witness_stack).der_encode = local_90;
  std::__cxx11::string::operator=
            ((string *)&(__return_storage_ptr__->witness_stack).sighash_type,(string *)&local_88);
  (__return_storage_ptr__->witness_stack).sighash_anyone_can_pay = (bool)local_78[0x10];
  (__return_storage_ptr__->witness_stack).sighash_rangeproof = (bool)local_78[0x11];
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(__return_storage_ptr__->witness_stack).ignore_items._M_t);
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_60._M_impl.super__Rb_tree_header;
    (__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color = local_60._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_parent = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_left = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_right = local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->witness_stack).ignore_items._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  if (local_d0._M_p != local_c0) {
    operator_delete(local_d0._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

UpdateWitnessStackTxInRequestStruct UpdateWitnessStackTxInRequest::ConvertToStruct() const {  // NOLINT
  UpdateWitnessStackTxInRequestStruct result;
  result.txid = txid_;
  result.vout = vout_;
  result.witness_stack = witness_stack_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}